

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_function.cpp
# Opt level: O1

int main(void)

{
  overflow_callback *poVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string input;
  enable_if_type<_std::is_void<result_type<unsigned_long_(&(basic_string<char>_&))(const_basic_string<char>_&)>_>::value,_std::pair<Mark,_result_type<unsigned_long_(&(basic_string<char>_&))(const_basic_string<char>_&)>_>_>
  result;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  enable_if_type<_std::is_void<result_type<unsigned_long_(&(basic_string<char>_&))(const_basic_string<char>_&)>_>::value,_std::pair<Mark,_result_type<unsigned_long_(&(basic_string<char>_&))(const_basic_string<char>_&)>_>_>
  local_60;
  
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"./sample/lipsum.txt","");
  bm::GenericBench<std::chrono::_V2::steady_clock>::
  mark<unsigned_long(&)(std::__cxx11::string_const&),std::__cxx11::string&>
            (&local_60,(GenericBench<std::chrono::_V2::steady_clock> *)count_words,
             (_func_unsigned_long_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)local_80,in_RCX);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total of ",9);
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ns after ",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," iterations",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Retval = ",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_60.first._overflow_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    poVar1 = &local_60.first._overflow_callback;
    (*local_60.first._overflow_callback.super__Function_base._M_manager)
              ((_Any_data *)poVar1,(_Any_data *)poVar1,__destroy_functor);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  return 0;
}

Assistant:

int main()
{
    std::string input("./sample/lipsum.txt");
    auto result = Bench::mark(count_words, input);
    std::cout << result.first << std::endl;
    std::cout << "Retval = " << result.second << std::endl;
    return 0;
}